

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

char cppqc::arbitrarySizedBoundedIntegral<signed_char>(RngEngine *rng,size_t size)

{
  char cVar1;
  double *pdVar2;
  undefined8 in_RSI;
  normal_distribution<double> *pnVar3;
  undefined1 auVar4 [16];
  double r;
  normal_distribution<double> dist;
  double limit;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffff98;
  normal_distribution<double> *in_stack_ffffffffffffffa0;
  normal_distribution<double> *pnVar5;
  result_type_conflict1 in_stack_ffffffffffffffa8;
  normal_distribution<double> *in_stack_ffffffffffffffb0;
  double local_28;
  double local_20;
  double local_18;
  
  auVar4._8_4_ = (int)((ulong)in_RSI >> 0x20);
  auVar4._0_8_ = in_RSI;
  auVar4._12_4_ = 0x45300000;
  local_20 = (auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0);
  cVar1 = std::numeric_limits<signed_char>::max();
  local_28 = (double)(int)cVar1;
  pdVar2 = std::min<double>(&local_20,&local_28);
  local_18 = *pdVar2;
  std::normal_distribution<double>::normal_distribution
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (result_type_conflict1)in_stack_ffffffffffffffa0);
  do {
    do {
      pnVar3 = (normal_distribution<double> *)
               std::normal_distribution<double>::operator()
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      pnVar5 = pnVar3;
      cVar1 = std::numeric_limits<signed_char>::lowest();
    } while ((double)pnVar3 < (double)(int)cVar1);
    pnVar3 = pnVar5;
    cVar1 = std::numeric_limits<signed_char>::max();
    in_stack_ffffffffffffffa0 = pnVar5;
  } while ((double)(int)cVar1 < (double)pnVar5);
  return (char)(int)(double)pnVar3;
}

Assistant:

Integral arbitrarySizedBoundedIntegral(RngEngine& rng, std::size_t size) {
  const double limit =
      std::min(double(size), double(std::numeric_limits<Integral>::max()));

  // When dividing by 3, about 99% of the values should be
  // in the interval [-limit, limit]
  std::normal_distribution<> dist{0, 1.0 + limit / 3};
  for (;;) {
    double r = dist(rng);

    if (!std::numeric_limits<Integral>::is_signed) {
      r = std::abs(r);
    }

    if (r >= std::numeric_limits<Integral>::lowest() &&
        r <= std::numeric_limits<Integral>::max()) {
      return static_cast<Integral>(r);
    }
  }
}